

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_GenOneHotIntervals(char *pFileName,int nPis,int nRegs,Vec_Ptr_t *vOnehots)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  int nDigitsOut;
  int nDigitsIn;
  int Counter2;
  int Counter;
  int iReg2;
  int iReg1;
  int k;
  int j;
  int i;
  FILE *pFile;
  Vec_Int_t *vLine;
  Vec_Ptr_t *vOnehots_local;
  int nRegs_local;
  int nPis_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"w");
  pcVar5 = Extra_TimeStamp();
  fprintf(__stream,"# One-hotness with %d vars and %d regs generated by ABC on %s\n",
          (ulong)(uint)nPis,(ulong)(uint)nRegs,pcVar5);
  uVar1 = Vec_PtrSize(vOnehots);
  fprintf(__stream,"# Used %d intervals of 1-hot registers: { ",(ulong)uVar1);
  nDigitsIn = 0;
  for (iReg2 = 0; iVar2 = Vec_PtrSize(vOnehots), iReg2 < iVar2; iReg2 = iReg2 + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vOnehots,iReg2);
    uVar1 = Vec_IntSize(pVVar6);
    fprintf(__stream,"%d ",(ulong)uVar1);
    iVar2 = Vec_IntSize(pVVar6);
    iVar4 = Vec_IntSize(pVVar6);
    nDigitsIn = (iVar2 * (iVar4 + -1)) / 2 + nDigitsIn;
  }
  fprintf(__stream,"}\n");
  fprintf(__stream,".model 1hot_%dvars_%dregs\n",(ulong)(uint)nPis,(ulong)(uint)nRegs);
  fprintf(__stream,".inputs");
  uVar1 = Abc_Base10Log(nPis + nRegs);
  for (k = 0; k < nPis + nRegs; k = k + 1) {
    fprintf(__stream," i%0*d",(ulong)uVar1,(ulong)(uint)k);
  }
  fprintf(__stream,"\n");
  fprintf(__stream,".outputs");
  uVar3 = Abc_Base10Log(nDigitsIn);
  for (k = 0; k < nDigitsIn; k = k + 1) {
    fprintf(__stream," o%0*d",(ulong)uVar3,(ulong)(uint)k);
  }
  fprintf(__stream,"\n");
  nDigitsOut = 0;
  for (iReg2 = 0; iVar2 = Vec_PtrSize(vOnehots), iReg2 < iVar2; iReg2 = iReg2 + 1) {
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(vOnehots,iReg2);
    for (k = 0; iVar2 = Vec_IntSize(pVVar6), k < iVar2; k = k + 1) {
      iVar2 = Vec_IntEntry(pVVar6,k);
      iReg1 = k;
      while( true ) {
        iReg1 = iReg1 + 1;
        iVar4 = Vec_IntSize(pVVar6);
        if (iVar4 <= iReg1) break;
        iVar4 = Vec_IntEntry(pVVar6,iReg1);
        fprintf(__stream,".names i%0*d i%0*d o%0*d\n",(ulong)uVar1,(ulong)(uint)(nPis + iVar2),
                (ulong)uVar1,(ulong)(uint)(nPis + iVar4),uVar3,nDigitsOut);
        fprintf(__stream,"11 0\n");
        nDigitsOut = nDigitsOut + 1;
      }
    }
  }
  if (nDigitsIn != nDigitsOut) {
    __assert_fail("Counter == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                  ,0x2a7,"void Abc_GenOneHotIntervals(char *, int, int, Vec_Ptr_t *)");
  }
  fprintf(__stream,".end\n");
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenOneHotIntervals( char * pFileName, int nPis, int nRegs, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vLine;
    FILE * pFile;
    int i, j, k, iReg1, iReg2, Counter, Counter2, nDigitsIn, nDigitsOut;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# One-hotness with %d vars and %d regs generated by ABC on %s\n", nPis, nRegs, Extra_TimeStamp() );
    fprintf( pFile, "# Used %d intervals of 1-hot registers: { ", Vec_PtrSize(vOnehots) );
    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        fprintf( pFile, "%d ", Vec_IntSize(vLine) );
        Counter += Vec_IntSize(vLine) * (Vec_IntSize(vLine) - 1) / 2;
    }
    fprintf( pFile, "}\n" );
    fprintf( pFile, ".model 1hot_%dvars_%dregs\n", nPis, nRegs );
    fprintf( pFile, ".inputs" );
    nDigitsIn = Abc_Base10Log( nPis+nRegs );
    for ( i = 0; i < nPis+nRegs; i++ )
        fprintf( pFile, " i%0*d", nDigitsIn, i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    nDigitsOut = Abc_Base10Log( Counter );
    for ( i = 0; i < Counter; i++ )
        fprintf( pFile, " o%0*d", nDigitsOut, i );
    fprintf( pFile, "\n" );
    Counter2 = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        Vec_IntForEachEntry( vLine, iReg1, i )
        Vec_IntForEachEntryStart( vLine, iReg2, j, i+1 )
        {
            fprintf( pFile, ".names i%0*d i%0*d o%0*d\n", nDigitsIn, nPis+iReg1, nDigitsIn, nPis+iReg2, nDigitsOut, Counter2 ); 
            fprintf( pFile, "11 0\n" ); 
            Counter2++;
        }
    }
    assert( Counter == Counter2 );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
    fclose( pFile );
}